

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall ThreadPoolMonoid::ThreadPoolMonoid(ThreadPoolMonoid *this)

{
  ThreadPool::ThreadPool(&this->_pool);
  return;
}

Assistant:

ThreadPoolMonoid() { }